

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

bool __thiscall Character::AddTradeItem(Character *this,short item,int amount)

{
  list<Character_Item,_std::allocator<Character_Item>_> *this_00;
  World *pWVar1;
  EIF *pEVar2;
  undefined1 *puVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  mapped_type *pmVar7;
  _List_node_base *p_Var8;
  allocator<char> local_51;
  Character_Item newitem;
  
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&newitem,"TradeAddQuantity",&local_51);
  pmVar7 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&newitem);
  bVar4 = util::variant::GetBool(pmVar7);
  std::__cxx11::string::~string((string *)&newitem);
  if ((0 < item) &&
     (pWVar1 = this->world, pEVar2 = pWVar1->eif,
     (ulong)(ushort)item <
     (ulong)(((long)(pEVar2->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar2->data).
                   super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x70))) {
    iVar5 = HasItem(this,item,!bVar4);
    if (iVar5 < amount) {
      amount = iVar5;
    }
    if (0 < amount) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&newitem,"MaxTrade",&local_51);
      pmVar7 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,(key_type *)&newitem);
      iVar5 = util::variant::GetInt(pmVar7);
      std::__cxx11::string::~string((string *)&newitem);
      if (amount <= iVar5) {
        if (!bVar4) {
LAB_00110f24:
          this_00 = &this->trade_inventory;
          p_Var8 = (_List_node_base *)this_00;
          do {
            p_Var8 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                      &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            if (p_Var8 == (_List_node_base *)this_00) {
              newitem.id = item;
              newitem.amount = amount;
              std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::push_back
                        (this_00,&newitem);
              CheckQuestRules(this);
              return true;
            }
          } while (*(short *)&p_Var8[1]._M_next != item);
          if (bVar4) {
            puVar3 = (undefined1 *)((long)&p_Var8[1]._M_next + 4);
            *(int *)puVar3 = *(int *)puVar3 + amount;
          }
          else {
            *(int *)((long)&p_Var8[1]._M_next + 4) = amount;
          }
          return true;
        }
        iVar5 = 0;
        p_Var8 = (_List_node_base *)&this->trade_inventory;
        while (p_Var8 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                         &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var8 != (_List_node_base *)&this->trade_inventory) {
          if (*(short *)&p_Var8[1]._M_next == item) {
            iVar5 = *(int *)((long)&p_Var8[1]._M_next + 4);
          }
        }
        if (-1 < iVar5 + amount) {
          pWVar1 = this->world;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&newitem,"MaxTrade",&local_51);
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&pWVar1->config,(key_type *)&newitem);
          iVar6 = util::variant::GetInt(pmVar7);
          std::__cxx11::string::~string((string *)&newitem);
          if (iVar5 + amount <= iVar6) goto LAB_00110f24;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Character::AddTradeItem(short item, int amount)
{
	bool trade_add_quantity = bool(this->world->config["TradeAddQuantity"]);

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	int hasitem = this->HasItem(item, !trade_add_quantity);

	amount = std::min(amount, hasitem);

	if (amount <= 0 || amount > int(this->world->config["MaxTrade"]))
	{
		return false;
	}

	// Prevent overflow
	if (trade_add_quantity)
	{
		int tradeitem = 0;

		UTIL_FOREACH(this->trade_inventory, trade_item)
		{
			if (trade_item.id == item)
			{
				tradeitem = trade_item.amount;
			}
		}

		if (tradeitem + amount < 0 || tradeitem + amount > int(this->world->config["MaxTrade"]))
		{
			return false;
		}

	}

	UTIL_FOREACH_REF(this->trade_inventory, character_item)
	{
		if (character_item.id == item)
		{
			if (trade_add_quantity)
				character_item.amount += amount;
			else
				character_item.amount = amount;

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->trade_inventory.push_back(newitem);
	this->CheckQuestRules();

	return true;
}